

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
* field::compute_powers(vector<field::GF2E,_std::allocator<field::GF2E>_> *Rs,size_t maxpow)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  GF2E GVar4;
  ulong in_RDX;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t i;
  size_t nbel;
  vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
  *res;
  GF2E *in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff80;
  ulong uVar5;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *this;
  size_type local_48;
  GF2E local_40;
  ulong local_38;
  undefined1 local_19;
  ulong local_18;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI);
  std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>::allocator
            ((allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_> *)0x12ef77);
  std::
  vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
  ::vector((vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
            *)this,(size_type)in_RSI,in_stack_ffffffffffffff80);
  std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>::~allocator
            ((allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_> *)0x12ef97);
  local_38 = 0;
  while (uVar5 = local_38,
        sVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI), uVar5 < sVar1)
  {
    std::
    vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
    ::operator[]((vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                  *)in_RDI,local_38);
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::resize(this,(size_type)in_RSI);
    GF2E::GF2E(&local_40,1);
    pvVar2 = std::
             vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             ::operator[]((vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                           *)in_RDI,local_38);
    pvVar3 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](pvVar2,0);
    pvVar3->data = local_40.data;
    for (local_48 = 1; local_48 < local_18; local_48 = local_48 + 1) {
      pvVar2 = std::
               vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
               ::operator[]((vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                             *)in_RDI,local_38);
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](pvVar2,local_48 - 1);
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RSI,local_38);
      GVar4 = GF2E::operator*(in_stack_ffffffffffffff68,(GF2E *)0x12f076);
      pvVar2 = std::
               vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
               ::operator[]((vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                             *)in_RDI,local_38);
      pvVar3 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](pvVar2,local_48);
      pvVar3->data = GVar4.data;
    }
    local_38 = local_38 + 1;
  }
  return (vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
          *)this;
}

Assistant:

std::vector<std::vector<GF2E>> compute_powers(std::vector<GF2E> Rs, size_t maxpow)
{
   std::vector<std::vector<GF2E>> res(Rs.size());
   for (size_t nbel = 0; nbel < Rs.size(); nbel ++)
   {
      res[nbel].resize(maxpow);
      res[nbel][0] = 1;
      for (size_t i=1; i < maxpow ; i++)
      {
         res[nbel][i] = res[nbel][i-1]*Rs[nbel];
      }
   }

   return res;
}